

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
pstore::small_vector<unsigned_char,_128UL>::push_back
          (small_vector<unsigned_char,_128UL> *this,uchar *v)

{
  ulong new_elements;
  ulong uVar1;
  
  uVar1 = this->elements_;
  new_elements = uVar1 + 1;
  if (new_elements < 0x81) {
    (this->small_buffer_)._M_elems[uVar1] = *v;
  }
  else {
    if (uVar1 < 0x81) {
      switch_to_big(this,new_elements);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->big_buffer_,v);
    this->buffer_ =
         (this->big_buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start;
  }
  this->elements_ = new_elements;
  return;
}

Assistant:

inline void small_vector<ElementType, BodyElements>::push_back (ElementType const & v) {
        auto const new_elements = elements_ + 1U;
        if (is_small (new_elements)) {
            small_buffer_[elements_] = v;
        } else {
            if (is_small (elements_)) {
                this->switch_to_big (new_elements);
            }
            big_buffer_.push_back (v);
            this->set_buffer_ptr (new_elements);
        }
        elements_ = new_elements;
    }